

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O3

bool QFileSystemEngine::setPermissions
               (QFileSystemEntry *entry,Permissions permissions,QSystemError *error)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  uint *puVar6;
  int *piVar7;
  uint uVar8;
  char *b;
  long lVar9;
  long in_FS_OFFSET;
  NativePath local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QFileSystemEntry::isEmpty(entry);
  if (bVar2) {
LAB_00170ca2:
    piVar7 = __errno_location();
    *piVar7 = 0x16;
  }
  else {
    QFileSystemEntry::nativeFilePath(&local_48,entry);
    pcVar1 = local_48.d.ptr;
    if (local_48.d.size == 0) {
LAB_00170bb4:
      lVar9 = -1;
    }
    else {
      pvVar5 = memchr(local_48.d.ptr,0,local_48.d.size);
      if (pvVar5 == (void *)0x0) goto LAB_00170bb4;
      lVar9 = (long)pvVar5 - (long)pcVar1;
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (lVar9 != -1) goto LAB_00170ca2;
    uVar3 = (uint)(((uint)permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                          super_QFlagsStorage<QFileDevice::Permission>.i & 0x4400) != 0) * 0x100;
    uVar8 = uVar3 + 0x80;
    if (((uint)permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
               super_QFlagsStorage<QFileDevice::Permission>.i & 0x2200) == 0) {
      uVar8 = uVar3;
    }
    uVar3 = uVar8 + 0x40;
    if (((uint)permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
               super_QFlagsStorage<QFileDevice::Permission>.i & 0x1100) == 0) {
      uVar3 = uVar8;
    }
    QFileSystemEntry::nativeFilePath(&local_48,entry);
    if (local_48.d.ptr == (char *)0x0) {
      local_48.d.ptr = "";
    }
    iVar4 = chmod(local_48.d.ptr,
                  (uint)permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                        super_QFlagsStorage<QFileDevice::Permission>.i >> 1 & 0x38 |
                  (uint)permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                        super_QFlagsStorage<QFileDevice::Permission>.i & 7 | uVar3);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (iVar4 == 0) {
      bVar2 = true;
      goto LAB_00170c85;
    }
    puVar6 = (uint *)__errno_location();
    *error = (QSystemError)((ulong)*puVar6 | 0x100000000);
  }
  bVar2 = false;
LAB_00170c85:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::setPermissions(const QFileSystemEntry &entry,
                                       QFile::Permissions permissions, QSystemError &error)
{
    Q_CHECK_FILE_NAME(entry, false);

    mode_t mode = QtPrivate::toMode_t(permissions);
    bool success = ::chmod(entry.nativeFilePath().constData(), mode) == 0;
    if (!success)
        error = QSystemError(errno, QSystemError::StandardLibraryError);
    return success;
}